

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O1

int array_list_del_idx(array_list *arr,size_t idx,size_t count)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  
  iVar1 = -1;
  uVar3 = count + idx;
  if ((!CARRY8(count,idx)) && (uVar3 <= arr->length && idx < arr->length)) {
    sVar2 = idx;
    sVar4 = count;
    if (idx < uVar3) {
      do {
        if (arr->array[sVar2] != (void *)0x0) {
          (*arr->free_fn)(arr->array[sVar2]);
        }
        sVar4 = sVar4 - 1;
        sVar2 = sVar2 + 1;
      } while (sVar4 != 0);
    }
    memmove(arr->array + idx,arr->array + uVar3,(arr->length - uVar3) * 8);
    arr->length = arr->length - count;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int array_list_del_idx(struct array_list *arr, size_t idx, size_t count)
{
	size_t i, stop;

	/* Avoid overflow in calculation with large indices. */
	if (idx > SIZE_T_MAX - count)
		return -1;
	stop = idx + count;
	if (idx >= arr->length || stop > arr->length)
		return -1;
	for (i = idx; i < stop; ++i)
	{
		// Because put_idx can skip entries, we need to check if
		// there's actually anything in each slot we're erasing.
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	}
	memmove(arr->array + idx, arr->array + stop, (arr->length - stop) * sizeof(void *));
	arr->length -= count;
	return 0;
}